

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int __thiscall
icu_63::RuleChain::select
          (RuleChain *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  IFixedDecimal *pIVar1;
  UBool UVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  ConstChar16Ptr local_30;
  IFixedDecimal *local_28;
  RuleChain *rules;
  IFixedDecimal *number_local;
  RuleChain *this_local;
  
  rules = (RuleChain *)__readfds;
  number_local = (IFixedDecimal *)CONCAT44(in_register_00000034,__nfds);
  this_local = this;
  uVar4 = (**(code **)(__readfds->fds_bits[0] + 0x18))();
  if (((uVar4 & 1) == 0) &&
     (uVar3 = (*rules->_vptr_RuleChain[4])(),
     pIVar1 = (IFixedDecimal *)CONCAT44(in_register_00000034,__nfds), (uVar3 & 1) == 0)) {
    while (local_28 = pIVar1, local_28 != (IFixedDecimal *)0x0) {
      UVar2 = OrConstraint::isFulfilled
                        ((OrConstraint *)local_28[10]._vptr_IFixedDecimal,(IFixedDecimal *)rules);
      if (UVar2 != '\0') {
        UnicodeString::UnicodeString((UnicodeString *)this,(UnicodeString *)(local_28 + 1));
        goto LAB_00316e4b;
      }
      pIVar1 = (IFixedDecimal *)local_28[9]._vptr_IFixedDecimal;
    }
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_30,(char16_t *)PLURAL_KEYWORD_OTHER);
  UnicodeString::UnicodeString((UnicodeString *)this,'\x01',&local_30,5);
  ConstChar16Ptr::~ConstChar16Ptr(&local_30);
LAB_00316e4b:
  return (int)this;
}

Assistant:

UnicodeString
RuleChain::select(const IFixedDecimal &number) const {
    if (!number.isNaN() && !number.isInfinite()) {
        for (const RuleChain *rules = this; rules != nullptr; rules = rules->fNext) {
             if (rules->ruleHeader->isFulfilled(number)) {
                 return rules->fKeyword;
             }
        }
    }
    return UnicodeString(TRUE, PLURAL_KEYWORD_OTHER, 5);
}